

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::util_deleteRows(HModel *this,int firstrow,int lastrow)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  int iVar7;
  pointer pdVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  
  printf("Called model.util_deleteRows(firstrow=%d, lastrow=%d)\n");
  std::ostream::flush();
  iVar1 = (lastrow - firstrow) + 1;
  if (lastrow - firstrow != 0 && firstrow <= lastrow) {
    pdVar6 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)firstrow;
    lVar10 = lastrow - lVar9;
    do {
      pdVar6[lVar9] = pdVar6[iVar1 + lVar9];
      pdVar8[lVar9] = pdVar8[iVar1 + lVar9];
      pdVar6 = pdVar6 + 1;
      pdVar8 = pdVar8 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  lVar9 = (long)this->numCol;
  piVar4 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar9 < 1) {
    iVar7 = 0;
  }
  else {
    piVar5 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = *piVar4;
    lVar10 = 0;
    iVar7 = 0;
    do {
      piVar4[lVar10] = iVar7;
      iVar11 = piVar4[lVar10 + 1];
      lVar10 = lVar10 + 1;
      if (iVar12 < iVar11) {
        pdVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar9 = (long)iVar12;
        do {
          iVar12 = piVar5[lVar9];
          if (iVar12 < firstrow || lastrow < iVar12) {
            iVar11 = iVar1;
            if (iVar12 < firstrow) {
              iVar11 = 0;
            }
            piVar5[iVar7] = iVar12 - iVar11;
            pdVar6[iVar7] = pdVar6[lVar9];
            iVar7 = iVar7 + 1;
            iVar11 = piVar4[lVar10];
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar11);
      }
      iVar12 = iVar11;
      lVar9 = (long)this->numCol;
    } while (lVar10 < lVar9);
  }
  piVar4[lVar9] = iVar7;
  uVar2 = this->numRow;
  uVar3 = this->numTot;
  this->numRow = uVar2 - iVar1;
  this->numTot = uVar3 - iVar1;
  mlFg_Update(this,this->mlFg_action_DelRows);
  return;
}

Assistant:

void HModel::util_deleteRows(int firstrow, int lastrow) {
  assert(firstrow >= 0);
  assert(lastrow < numRow);
  assert(firstrow <= lastrow);
#ifdef JAJH_dev
  printf("Called model.util_deleteRows(firstrow=%d, lastrow=%d)\n", firstrow, lastrow);cout << flush;
#endif
  int rowStep = lastrow-firstrow+1;
  for (int row = firstrow; row < lastrow; row++) {
    rowLower[row] = rowLower[rowStep+row];
    rowUpper[row] = rowUpper[rowStep+row];
    //    rowScale[row] = rowScale[rowStep+row];
  }

  int nnz = 0;
  for (int col = 0; col < numCol; col++) {
    int fmEl = Astart[col];
    Astart[col] = nnz;
    for (int el = fmEl; el < Astart[col+1]; el++) {
      int row = Aindex[el];
      if (row < firstrow || row > lastrow) {
	if (row < firstrow) {
	  Aindex[nnz] = row;
	} else {
	  Aindex[nnz] = row-rowStep;
	}
	Avalue[nnz] = Avalue[el];
	nnz++;
      }
    }
  }
  Astart[numCol] = nnz;

  //Reduce the number of rows and total number of variables in the model
  numRow -= rowStep;
  numTot -= rowStep;

  //Determine consequences for basis when deleting rows
  mlFg_Update(mlFg_action_DelRows);
 
}